

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::f_fedot(Forth *this)

{
  long lVar1;
  long lVar2;
  Cell CVar3;
  ostream *poVar4;
  double dVar5;
  
  requireFStackDepth(this,1,"FE.");
  if (this->writeToTarget == ToStdCout) {
    CVar3 = getNumericBase(this);
    poVar4 = std::operator<<(&std::cout,CVar3);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(long *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = (long)(int)this->precision_;
    dVar5 = ForthStack<double>::getTop(&this->fStack);
    std::ostream::_M_insert<double>(dVar5);
    std::ostream::flush();
  }
  else if (this->writeToTarget == ToString) {
    CVar3 = getNumericBase(this);
    poVar4 = std::operator<<(&this->field_0x20,CVar3);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(long *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = (long)(int)this->precision_;
    dVar5 = ForthStack<double>::getTop(&this->fStack);
    std::ostream::_M_insert<double>(dVar5);
  }
  ForthStack<double>::pop(&this->fStack);
  return;
}

Assistant:

void f_fedot() {
			REQUIRE_FSTACK_DEPTH(1, "FE.");
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::scientific << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::scientific << std::setprecision(precision_) << static_cast<FCell>(fStack.getTop());
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
			fStack.pop();
		}